

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  char cVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  uint32_t uVar16;
  ExecutionModel EVar17;
  SPIRType *pSVar18;
  undefined7 extraout_var;
  undefined8 *puVar19;
  long *plVar20;
  SPIRVariable *pSVar21;
  SPIRType *pSVar22;
  runtime_error *this_00;
  undefined4 uVar23;
  ulong *puVar24;
  size_type *psVar25;
  uint uVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  undefined8 uVar30;
  char (*ts_2) [2];
  SPIRType *pSVar31;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar32;
  char (*in_stack_fffffffffffffbf8) [2];
  ID local_3fc;
  string decl_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  uint32_t local_3b4;
  char *overlapping_binding_tag;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  string *local_390;
  uint32_t local_388;
  undefined4 local_384;
  string array_type;
  string __str_1;
  string __str;
  string pack_pfx;
  string base_type;
  uint *local_2d0;
  uint local_2b8 [8];
  bool *local_298;
  size_t local_290;
  bool local_280 [40];
  TypedID<(spirv_cross::Types)1> *local_258;
  size_t local_250;
  TypedID<(spirv_cross::Types)1> local_240 [8];
  uint *local_220;
  size_t local_218;
  uint local_208 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  SPIRType row_major_physical_type;
  
  local_390 = __return_storage_ptr__;
  bVar13 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  uVar16 = member_type_id;
  if (bVar13) {
    uVar16 = Compiler::get_extended_member_decoration
                       ((Compiler *)this,(type->super_IVariant).self.id,index,
                        SPIRVCrossDecorationPhysicalTypeID);
  }
  pSVar18 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar16);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar13 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationInterfaceOrigID);
  local_3fc.id = 0;
  if (bVar13) {
    local_3fc.id = Compiler::get_extended_member_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,index,
                              SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar13 = Compiler::is_matrix((Compiler *)this,pSVar18);
  local_384 = 0;
  if (bVar13) {
    bVar13 = Compiler::has_member_decoration
                       ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                        DecorationRowMajor);
    local_384 = (undefined4)CONCAT71(extraout_var,bVar13);
  }
  row_major_physical_type.array.super_VectorView<unsigned_int>.ptr =
       (uint *)&row_major_physical_type.array.stack_storage;
  row_major_physical_type.super_IVariant.self.id = 0;
  row_major_physical_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
  row_major_physical_type.super_IVariant._12_4_ = 0x18;
  row_major_physical_type.basetype = Unknown;
  row_major_physical_type.width = 0;
  row_major_physical_type.vecsize = 1;
  row_major_physical_type.columns = 1;
  row_major_physical_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  row_major_physical_type.array.buffer_capacity = 8;
  row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&row_major_physical_type.array_size_literal.stack_storage;
  row_major_physical_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  row_major_physical_type.array_size_literal.buffer_capacity = 8;
  row_major_physical_type._120_8_ = (ulong)(ushort)row_major_physical_type._126_2_ << 0x30;
  row_major_physical_type.cooperative.use_id = 0;
  row_major_physical_type.cooperative.rows_id = 0;
  row_major_physical_type.cooperative.columns_id = 0;
  row_major_physical_type.cooperative.scope_id = 0;
  row_major_physical_type.storage = StorageClassGeneric;
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&row_major_physical_type.member_types.stack_storage;
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  row_major_physical_type.member_types.buffer_capacity = 8;
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&row_major_physical_type.member_type_index_redirection.stack_storage;
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
       0;
  row_major_physical_type.member_type_index_redirection.buffer_capacity = 8;
  row_major_physical_type.member_name_cache._M_h._M_buckets =
       &row_major_physical_type.member_name_cache._M_h._M_single_bucket;
  row_major_physical_type.image._0_7_ = 0;
  row_major_physical_type.image._7_4_ = 0;
  row_major_physical_type.parent_type.id = 0;
  row_major_physical_type.image.sampled = 0;
  row_major_physical_type.image.format = ImageFormatUnknown;
  row_major_physical_type.image.access = AccessQualifierReadOnly;
  row_major_physical_type.type_alias.id = 0;
  row_major_physical_type.member_name_cache._M_h._M_bucket_count = 1;
  row_major_physical_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  row_major_physical_type.member_name_cache._M_h._M_element_count = 0;
  row_major_physical_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  row_major_physical_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  row_major_physical_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar13 = Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset
                     );
  if ((bVar13) ||
     (bVar13 = Compiler::has_extended_member_decoration
                         ((Compiler *)this,(type->super_IVariant).self.id,index,
                          SPIRVCrossDecorationResourceIndexPrimary), bVar13)) {
    this->is_using_builtin_array = true;
  }
  bVar13 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar31 = pSVar18;
  if (bVar13) {
    if (pSVar18->basetype == Struct) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot emit a packed struct currently.");
      goto LAB_00227ea9;
    }
    bVar13 = Compiler::is_matrix((Compiler *)this,pSVar18);
    if (!bVar13) {
      bVar13 = Compiler::is_scalar((Compiler *)this,pSVar18);
      if (!bVar13) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2bb4c6);
      }
      goto LAB_00227503;
    }
    uVar16 = pSVar18->vecsize;
    local_3b4 = pSVar18->columns;
    ::std::__cxx11::string::_M_replace
              ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2bb4c6);
    if ((char)local_384 != '\0') {
      local_3b4 = pSVar18->vecsize;
      uVar16 = pSVar18->columns;
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2d3db0);
    }
    bVar13 = pSVar18->width == 0x10;
    pcVar28 = "float";
    if (bVar13) {
      pcVar28 = "half";
    }
    base_type._M_dataplus._M_p = (pointer)&base_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&base_type,pcVar28,pcVar28 + ((ulong)bVar13 ^ 5));
    array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&array_type,"typedef ","");
    ::std::operator+(&local_3d8,"packed_",&base_type);
    cVar14 = '\x01';
    if (9 < uVar16) {
      uVar29 = (ulong)uVar16;
      cVar12 = '\x04';
      do {
        cVar14 = cVar12;
        uVar26 = (uint)uVar29;
        if (uVar26 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00226eba;
        }
        if (uVar26 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00226eba;
        }
        if (uVar26 < 10000) goto LAB_00226eba;
        uVar29 = uVar29 / 10000;
        cVar12 = cVar14 + '\x04';
      } while (99999 < uVar26);
      cVar14 = cVar14 + '\x01';
    }
LAB_00226eba:
    overlapping_binding_tag = (char *)&local_3a0;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_3a8,uVar16);
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      uVar30 = local_3d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < local_3a8 + local_3d8._M_string_length) {
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)overlapping_binding_tag != &local_3a0) {
        uVar30 = local_3a0._M_allocated_capacity;
      }
      if ((ulong)uVar30 < local_3a8 + local_3d8._M_string_length) goto LAB_00226f27;
      puVar19 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&overlapping_binding_tag,0,(char *)0x0,
                           (ulong)local_3d8._M_dataplus._M_p);
    }
    else {
LAB_00226f27:
      puVar19 = (undefined8 *)
                ::std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)overlapping_binding_tag)
      ;
    }
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar25 = puVar19 + 2;
    if ((size_type *)*puVar19 == psVar25) {
      decl_type.field_2._M_allocated_capacity = *psVar25;
      decl_type.field_2._8_8_ = puVar19[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar25;
      decl_type._M_dataplus._M_p = (pointer)*puVar19;
    }
    decl_type._M_string_length = puVar19[1];
    *puVar19 = psVar25;
    puVar19[1] = 0;
    *(char *)psVar25 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)overlapping_binding_tag != &local_3a0) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    ::std::operator+(&decl_type," ",&pack_pfx);
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    uVar26 = pSVar18->columns;
    cVar14 = '\x01';
    if (9 < uVar26) {
      uVar27 = uVar26;
      cVar12 = '\x04';
      do {
        cVar14 = cVar12;
        if (uVar27 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0022706d;
        }
        if (uVar27 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0022706d;
        }
        if (uVar27 < 10000) goto LAB_0022706d;
        bVar13 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar12 = cVar14 + '\x04';
      } while (bVar13);
      cVar14 = cVar14 + '\x01';
    }
LAB_0022706d:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,cVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar26);
    plVar20 = (long *)::std::__cxx11::string::replace
                                ((ulong)&__str,0,(char *)0x0,(ulong)base_type._M_dataplus._M_p);
    overlapping_binding_tag = (char *)&local_3a0;
    puVar24 = (ulong *)(plVar20 + 2);
    if ((ulong *)*plVar20 == puVar24) {
      local_3a0._M_allocated_capacity = *puVar24;
      local_3a0._8_8_ = plVar20[3];
    }
    else {
      local_3a0._M_allocated_capacity = *puVar24;
      overlapping_binding_tag = (char *)*plVar20;
    }
    local_3a8 = plVar20[1];
    *plVar20 = (long)puVar24;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    plVar20 = (long *)::std::__cxx11::string::append((char *)&overlapping_binding_tag);
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    puVar24 = (ulong *)(plVar20 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar20 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_3d8.field_2._M_allocated_capacity = *puVar24;
      local_3d8.field_2._8_8_ = plVar20[3];
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *puVar24;
      local_3d8._M_dataplus._M_p = (pointer)*plVar20;
    }
    local_3d8._M_string_length = plVar20[1];
    *plVar20 = (long)puVar24;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    uVar26 = pSVar18->vecsize;
    cVar14 = '\x01';
    if (9 < uVar26) {
      uVar27 = uVar26;
      cVar12 = '\x04';
      do {
        cVar14 = cVar12;
        if (uVar27 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_002271b0;
        }
        if (uVar27 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_002271b0;
        }
        if (uVar27 < 10000) goto LAB_002271b0;
        bVar13 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar12 = cVar14 + '\x04';
      } while (bVar13);
      cVar14 = cVar14 + '\x01';
    }
LAB_002271b0:
    paVar1 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar26);
    uVar29 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             local_3d8._M_string_length;
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      uVar30 = local_3d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < uVar29) {
      uVar30 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        uVar30 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar30 < uVar29) goto LAB_00227234;
      puVar19 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&__str_1,0,(char *)0x0,(ulong)local_3d8._M_dataplus._M_p);
    }
    else {
LAB_00227234:
      puVar19 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_3d8,(ulong)__str_1._M_dataplus._M_p);
    }
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar25 = puVar19 + 2;
    if ((size_type *)*puVar19 == psVar25) {
      decl_type.field_2._M_allocated_capacity = *psVar25;
      decl_type.field_2._8_8_ = puVar19[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar25;
      decl_type._M_dataplus._M_p = (pointer)*puVar19;
    }
    decl_type._M_string_length = puVar19[1];
    *puVar19 = psVar25;
    puVar19[1] = 0;
    *(char *)psVar25 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)overlapping_binding_tag != &local_3a0) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    cVar14 = '\x01';
    if (9 < local_3b4) {
      uVar16 = local_3b4;
      cVar12 = '\x04';
      do {
        cVar14 = cVar12;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0022736d;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0022736d;
        }
        if (uVar16 < 10000) goto LAB_0022736d;
        bVar13 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar12 = cVar14 + '\x04';
      } while (bVar13);
      cVar14 = cVar14 + '\x01';
    }
LAB_0022736d:
    overlapping_binding_tag = (char *)&local_3a0;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_3a8,local_3b4);
    plVar20 = (long *)::std::__cxx11::string::replace
                                ((ulong)&overlapping_binding_tag,0,(char *)0x0,0x2c1a1a);
    puVar24 = (ulong *)(plVar20 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar20 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_3d8.field_2._M_allocated_capacity = *puVar24;
      local_3d8.field_2._8_8_ = plVar20[3];
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *puVar24;
      local_3d8._M_dataplus._M_p = (pointer)*plVar20;
    }
    local_3d8._M_string_length = plVar20[1];
    *plVar20 = (long)puVar24;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    plVar20 = (long *)::std::__cxx11::string::append((char *)&local_3d8);
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar25 = (size_type *)(plVar20 + 2);
    if ((size_type *)*plVar20 == psVar25) {
      decl_type.field_2._M_allocated_capacity = *psVar25;
      decl_type.field_2._8_8_ = plVar20[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar25;
      decl_type._M_dataplus._M_p = (pointer)*plVar20;
    }
    decl_type._M_string_length = plVar20[1];
    *plVar20 = (long)psVar25;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)overlapping_binding_tag != &local_3a0) {
      operator_delete(overlapping_binding_tag);
    }
    ::std::__cxx11::string::append((char *)&array_type);
    pVar32 = ::std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->typedef_lines,&array_type);
    if (((undefined1  [16])pVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Compiler::force_recompile((Compiler *)this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)array_type._M_dataplus._M_p != &array_type.field_2) {
      operator_delete(array_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    bVar13 = Compiler::is_matrix((Compiler *)this,pSVar18);
    if (bVar13) {
      if (((this->msl_options).msl_version < 30000) &&
         (bVar13 = Compiler::has_extended_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,
                              SPIRVCrossDecorationWorkgroupStruct), bVar13)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2d3dc4);
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        this->is_using_builtin_array = true;
      }
      if ((char)local_384 != '\0') {
        row_major_physical_type.super_IVariant.self.id = (pSVar18->super_IVariant).self.id;
        row_major_physical_type.columns = pSVar18->columns;
        row_major_physical_type._12_8_ = *(undefined8 *)&(pSVar18->super_IVariant).field_0xc;
        uVar2 = pSVar18->width;
        uVar3 = pSVar18->vecsize;
        row_major_physical_type.width = uVar2;
        row_major_physical_type.vecsize = uVar3;
        SmallVector<unsigned_int,_8UL>::operator=(&row_major_physical_type.array,&pSVar18->array);
        SmallVector<bool,_8UL>::operator=
                  (&row_major_physical_type.array_size_literal,&pSVar18->array_size_literal);
        row_major_physical_type.pointer_depth = pSVar18->pointer_depth;
        row_major_physical_type.pointer = pSVar18->pointer;
        row_major_physical_type.forward_pointer = pSVar18->forward_pointer;
        row_major_physical_type._126_2_ = *(undefined2 *)&pSVar18->field_0x7e;
        uVar4 = (pSVar18->cooperative).use_id;
        uVar5 = (pSVar18->cooperative).rows_id;
        uVar6 = (pSVar18->cooperative).columns_id;
        uVar30 = *(undefined8 *)&(pSVar18->cooperative).scope_id;
        row_major_physical_type.cooperative.scope_id = (uint32_t)uVar30;
        row_major_physical_type.storage = (StorageClass)((ulong)uVar30 >> 0x20);
        row_major_physical_type.cooperative.use_id = uVar4;
        row_major_physical_type.cooperative.rows_id = uVar5;
        row_major_physical_type.cooperative.columns_id = uVar6;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  (&row_major_physical_type.member_types,&pSVar18->member_types);
        SmallVector<unsigned_int,_8UL>::operator=
                  (&row_major_physical_type.member_type_index_redirection,
                   &pSVar18->member_type_index_redirection);
        uVar30._0_4_ = (pSVar18->image).type;
        uVar30._4_4_ = (pSVar18->image).dim;
        uVar7._0_1_ = (pSVar18->image).depth;
        uVar7._1_1_ = (pSVar18->image).arrayed;
        uVar7._2_1_ = (pSVar18->image).ms;
        uVar7._3_1_ = (pSVar18->image).field_0xb;
        uVar7._4_4_ = (pSVar18->image).sampled;
        uVar8 = (pSVar18->image).format;
        uVar9 = (pSVar18->image).access;
        uVar10 = pSVar18->type_alias;
        uVar11 = pSVar18->parent_type;
        row_major_physical_type.image._0_7_ = SUB87(uVar30,0);
        row_major_physical_type.image.dim._3_1_ = (undefined1)((uint)uVar30._4_4_ >> 0x18);
        row_major_physical_type.image._8_3_ = SUB83(uVar7,0);
        row_major_physical_type.image._11_1_ = uVar7._3_1_;
        row_major_physical_type.image.sampled = uVar7._4_4_;
        row_major_physical_type.image.format = uVar8;
        row_major_physical_type.image.access = uVar9;
        row_major_physical_type.type_alias.id = uVar10;
        row_major_physical_type.parent_type.id = uVar11;
        if (pSVar18 != &row_major_physical_type) {
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&row_major_physical_type.member_name_cache,
                     &(pSVar18->member_name_cache)._M_h);
        }
        uVar16 = row_major_physical_type.vecsize;
        row_major_physical_type.vecsize = row_major_physical_type.columns;
        row_major_physical_type.columns = uVar16;
        pSVar31 = &row_major_physical_type;
      }
    }
  }
LAB_00227503:
  if ((((pSVar18->basetype == Image) && ((pSVar18->image).sampled == 2)) &&
      ((this->msl_options).platform == iOS)) &&
     (((int)(this->msl_options).argument_buffers_tier < 1 &&
      (bVar13 = Compiler::has_decoration((Compiler *)this,local_3fc,DecorationNonWritable), !bVar13)
      ))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"Writable images are not allowed on Tier1 argument buffers on iOS.");
LAB_00227ea9:
    *(undefined ***)this_00 = &PTR__runtime_error_0035fca8;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  if (2 < pSVar18->basetype - Image) {
    decl_type._M_dataplus._M_p._0_4_ = 0x7fffffff;
    uVar29 = (ulong)(this->stage_out_var_id).id;
    if (uVar29 == 0) {
LAB_002275a9:
      uVar29 = (ulong)(this->stage_in_var_id).id;
      if (uVar29 != 0) {
        pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + uVar29);
        pSVar22 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
        if (((pSVar22->super_IVariant).self.id == (type->super_IVariant).self.id) &&
           (bVar13 = variable_storage_requires_stage_io(this,StorageClassInput), bVar13))
        goto LAB_002275fb;
      }
      EVar17 = Compiler::get_execution_model((Compiler *)this);
      if (EVar17 == ExecutionModelMeshEXT) goto LAB_002275fb;
    }
    else {
      pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar29);
      pSVar22 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
      if (((pSVar22->super_IVariant).self.id != (type->super_IVariant).self.id) ||
         ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_002275a9;
LAB_002275fb:
      bVar13 = Compiler::is_member_builtin((Compiler *)this,type,index,(BuiltIn *)&decl_type);
      if (bVar13) {
        this->is_using_builtin_array = true;
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&base_type,this,pSVar18,(ulong)local_3fc.id);
    ::std::__cxx11::string::operator=((string *)&array_type,(string *)&base_type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  EVar17 = Compiler::get_execution_model((Compiler *)this);
  if (EVar17 == ExecutionModelMeshEXT) {
    __str_1._M_dataplus._M_p._0_4_ = 0x7fffffff;
    bVar13 = Compiler::is_member_builtin((Compiler *)this,type,index,(BuiltIn *)&__str_1);
    if (bVar13) {
      if ((uint)__str_1._M_dataplus._M_p == 0x1150) {
        this->is_using_builtin_array = false;
        (local_390->_M_dataplus)._M_p = (pointer)&local_390->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"");
      }
      else {
        SPIRType::SPIRType((SPIRType *)&base_type,pSVar31);
        if (((uint)__str_1._M_dataplus._M_p < 0xb) &&
           ((0x680U >> ((uint)__str_1._M_dataplus._M_p & 0x1f) & 1) != 0)) {
          uVar23 = 8;
LAB_00227711:
          base_type.field_2._M_allocated_capacity._0_4_ = uVar23;
        }
        else {
          uVar23 = 2;
          if ((uint)__str_1._M_dataplus._M_p == 0x14b3) goto LAB_00227711;
        }
        this->is_using_builtin_array = true;
        (local_390->_M_dataplus)._M_p = (pointer)&local_390->field_2;
        local_390->_M_string_length = 0;
        (local_390->field_2)._M_local_buf[0] = '\0';
        local_388 = index;
        bVar15 = Compiler::has_member_decoration
                           ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,local_3fc.id,
                            DecorationBuiltIn);
        if (bVar15) {
          type_to_glsl_abi_cxx11_(&local_3d8,this,(SPIRType *)&base_type,local_3fc.id,false);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    (&overlapping_binding_tag,this,(ulong)__str_1._M_dataplus._M_p & 0xffffffff,3);
          member_attribute_qualifier_abi_cxx11_(&__str,this,type,local_388);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (&decl_type,(spirv_cross *)&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                     (char (*) [2])qualifier,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &overlapping_binding_tag,&__str,&array_type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d6cfb,
                     in_stack_fffffffffffffbf8);
          ::std::__cxx11::string::operator=((string *)local_390,(string *)&decl_type);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
            operator_delete(decl_type._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)overlapping_binding_tag != &local_3a0) {
            operator_delete(overlapping_binding_tag);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
LAB_00227934:
            operator_delete(local_3d8._M_dataplus._M_p);
          }
        }
        else {
          type_to_glsl_abi_cxx11_(&local_3d8,this,(SPIRType *)&base_type,local_3fc.id,false);
          uVar16 = local_388;
          CompilerGLSL::to_member_name_abi_cxx11_
                    ((string *)&overlapping_binding_tag,&this->super_CompilerGLSL,type,local_388);
          member_attribute_qualifier_abi_cxx11_(&__str,this,type,uVar16);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (&decl_type,(spirv_cross *)&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                     (char (*) [2])qualifier,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &overlapping_binding_tag,&__str,&array_type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d6cfb,
                     in_stack_fffffffffffffbf8);
          ::std::__cxx11::string::operator=((string *)local_390,(string *)&decl_type);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
            operator_delete(decl_type._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)overlapping_binding_tag != &local_3a0) {
            operator_delete(overlapping_binding_tag);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) goto LAB_00227934;
        }
        this->is_using_builtin_array = false;
        base_type._M_dataplus._M_p = (pointer)&PTR__SPIRType_00360128;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_1c8);
        local_218 = 0;
        if (local_220 != local_208) {
          free(local_220);
        }
        index = local_388;
        local_250 = 0;
        if (local_258 != local_240) {
          free(local_258);
        }
        local_290 = 0;
        if (local_298 != local_280) {
          free(local_298);
        }
        if (local_2d0 != local_2b8) {
          free(local_2d0);
        }
      }
      if (bVar13) goto LAB_00227d70;
    }
  }
  if (local_3fc.id != 0) {
    bVar13 = Compiler::is_pointer((Compiler *)this,pSVar31);
    pSVar18 = pSVar31;
    if (bVar13) {
      pSVar18 = Compiler::get_pointee_type((Compiler *)this,pSVar31);
    }
    bVar13 = Compiler::is_array((Compiler *)this,pSVar18);
    if ((bVar13) && (uVar16 = get_resource_array_size(this,pSVar18,local_3fc.id), uVar16 == 0)) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&array_type,0,(char *)array_type._M_string_length,0x2d3e12);
    }
  }
  decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
  decl_type._M_string_length = 0;
  decl_type.field_2._M_allocated_capacity =
       decl_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pSVar31->vecsize < 5) {
    type_to_glsl_abi_cxx11_(&base_type,this,pSVar31,local_3fc.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&base_type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    pSVar18 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
    SPIRType::SPIRType((SPIRType *)&base_type,pSVar18);
    bVar13 = Compiler::is_matrix((Compiler *)this,(SPIRType *)&base_type);
    if (((byte)local_384 & bVar13) == 1) {
      base_type.field_2._8_8_ = base_type.field_2._8_8_ >> 0x20;
    }
    base_type.field_2._12_4_ = 1;
    ts_2 = (char (*) [2])0x1;
    type_to_glsl_abi_cxx11_(&local_3d8,this,(SPIRType *)&base_type,local_3fc.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if (pSVar31->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (&local_3d8,(spirv_cross *)"spvPaddedStd140<",(char (*) [17])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49aa,ts_2)
      ;
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3d8);
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_3d8,(spirv_cross *)"spvPaddedStd140Matrix<",(char (*) [23])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d38e3,
                 (char (*) [3])&pSVar31->columns,(uint *)0x2d49aa,in_stack_fffffffffffffbf8);
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    base_type._M_dataplus._M_p = (pointer)&PTR__SPIRType_00360128;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1c8);
    local_218 = 0;
    if (local_220 != local_208) {
      free(local_220);
    }
    local_250 = 0;
    if (local_258 != local_240) {
      free(local_258);
    }
    local_290 = 0;
    if (local_298 != local_280) {
      free(local_298);
    }
    if (local_2d0 != local_2b8) {
      free(local_2d0);
    }
  }
  bVar13 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationOverlappingBinding);
  overlapping_binding_tag = "";
  if (bVar13) {
    overlapping_binding_tag = "// Overlapping binding: ";
  }
  CompilerGLSL::to_member_name_abi_cxx11_(&base_type,&this->super_CompilerGLSL,type,index);
  member_attribute_qualifier_abi_cxx11_(&local_3d8,this,type,index);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (local_390,(spirv_cross *)&overlapping_binding_tag,(char **)&pack_pfx,&decl_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
             (char (*) [2])qualifier,&base_type,&local_3d8,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d6cfb,
             in_stack_fffffffffffffbf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_type._M_dataplus._M_p != &base_type.field_2) {
    operator_delete(base_type._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
    operator_delete(decl_type._M_dataplus._M_p);
  }
LAB_00227d70:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != &array_type.field_2) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  row_major_physical_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&row_major_physical_type.member_name_cache._M_h);
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
       0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &row_major_physical_type.member_type_index_redirection.stack_storage) {
    free(row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      row_major_physical_type.member_types.
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &row_major_physical_type.member_types.stack_storage) {
    free(row_major_physical_type.member_types.
         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  row_major_physical_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)
      row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr !=
      &row_major_physical_type.array_size_literal.stack_storage) {
    free(row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  row_major_physical_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      row_major_physical_type.array.super_VectorView<unsigned_int>.ptr !=
      &row_major_physical_type.array.stack_storage) {
    free(row_major_physical_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return local_390;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput))) ||
				is_mesh_shader();
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (is_mesh_shader())
	{
		BuiltIn builtin = BuiltInMax;
		if (is_member_builtin(type, index, &builtin))
		{
			if (builtin == BuiltInPrimitiveShadingRateKHR)
			{
				// not supported in metal 3.0
				is_using_builtin_array = false;
				return "";
			}

			SPIRType metallic_type = *declared_type;
			if (builtin == BuiltInCullPrimitiveEXT)
				metallic_type.basetype = SPIRType::Boolean;
			else if (builtin == BuiltInPrimitiveId || builtin == BuiltInLayer || builtin == BuiltInViewportIndex)
				metallic_type.basetype = SPIRType::UInt;

			is_using_builtin_array = true;
			std::string result;
			if (has_member_decoration(type.self, orig_id, DecorationBuiltIn))
			{
				// avoid '_RESERVED_IDENTIFIER_FIXUP_' in variable name
				result = join(type_to_glsl(metallic_type, orig_id, false), " ", qualifier,
				              builtin_to_glsl(builtin, StorageClassOutput), member_attribute_qualifier(type, index),
				              array_type, ";");
			}
			else
			{
				result = join(type_to_glsl(metallic_type, orig_id, false), " ", qualifier,
				              to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");
			}
			is_using_builtin_array = false;
			return result;
		}
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}